

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void AddWindowToSortBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  uint uVar1;
  ImGuiWindow *window_00;
  ulong uVar2;
  ulong uVar3;
  ImGuiWindow *window_local;
  
  window_local = window;
  ImVector<ImGuiWindow_*>::push_back(out_sorted_windows,&window_local);
  if (window_local->Active == true) {
    uVar1 = (window_local->DC).ChildWindows.Size;
    if (1 < (long)(int)uVar1) {
      qsort((window_local->DC).ChildWindows.Data,(long)(int)uVar1,8,ChildWindowComparer);
    }
    uVar3 = 0;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      window_00 = (window_local->DC).ChildWindows.Data[uVar3];
      if (window_00->Active == true) {
        AddWindowToSortBuffer(out_sorted_windows,window_00);
      }
    }
  }
  return;
}

Assistant:

static void AddWindowToSortBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            ImQsort(window->DC.ChildWindows.begin(), (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortBuffer(out_sorted_windows, child);
        }
    }
}